

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2PRendezvousServer.cpp
# Opt level: O1

void __thiscall MyServerConnection::OnClose(MyServerConnection *this,SDKJsonResult *reason)

{
  ostringstream *this_00;
  pointer pcVar1;
  size_t sVar2;
  OutputWorker *this_01;
  TonkStatusEx status;
  char *local_248;
  long local_240;
  char local_238 [16];
  TonkStatusEx local_228;
  undefined1 local_1a8 [392];
  
  tonk::SDKConnection::GetStatusEx(&local_228,&this->super_SDKConnection);
  pcVar1 = (reason->ErrorJson)._M_dataplus._M_p;
  local_248 = local_238;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar1,pcVar1 + (reason->ErrorJson)._M_string_length);
  if ((int)Logger.ChannelMinLevel < 3) {
    this_00 = (ostringstream *)(local_1a8 + 0x10);
    local_1a8._0_8_ = Logger.ChannelName;
    local_1a8._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"Client disconnected from ",0x19);
    sVar2 = strlen(local_228.Remote.NetworkString);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,local_228.Remote.NetworkString,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," : ",3);
    std::ostream::_M_insert<unsigned_long>((ulong)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," - Reason = ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,local_248,local_240);
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,(LogStringBuffer *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  tonk::SDKConnectionList<MyServerConnection>::Remove
            (&this->Server->ConnectionList,&this->super_SDKConnection);
  return;
}

Assistant:

void MyServerConnection::OnClose(
    const tonk::SDKJsonResult& reason
)
{
    auto status = GetStatusEx();

    Logger.Info("Client disconnected from ", status.Remote.NetworkString, " : ", status.Remote.UDPPort, " - Reason = ", reason.ToString());

    Server->ConnectionList.Remove(this);
}